

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *camera,ssize_t id
          )

{
  ulong uVar1;
  size_t sVar2;
  int __oflag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  Ref<embree::SceneGraph::Node> *in_stack_00000168;
  XMLWriter *in_stack_00000170;
  undefined8 in_stack_fffffffffffffda8;
  float __val;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_1f9;
  string local_1f8 [32];
  PerspectiveCameraNode *local_1d8;
  ulong local_1d0;
  string local_1c8 [32];
  string local_1a8 [55];
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [56];
  PerspectiveCameraNode **local_58;
  reference local_20;
  PerspectiveCameraNode **local_18;
  PerspectiveCameraNode *local_10;
  PerspectiveCameraNode **local_8;
  
  __val = (float)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"AnimatedPerspectiveCamera ",&local_171);
  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)in_RSI;
  std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  std::__cxx11::to_string(__val);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  std::__cxx11::to_string(__val);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  open(in_RDI,(char *)local_90,__oflag);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_1d0 = 0;
  while( true ) {
    uVar1 = local_1d0;
    sVar2 = SceneGraph::AnimatedPerspectiveCameraNode::size
                      ((AnimatedPerspectiveCameraNode *)0x432e5c);
    if (sVar2 <= uVar1) break;
    local_20 = std::
               vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                             *)(*(long *)in_RSI + 0xb8),local_1d0);
    local_18 = &local_1d8;
    local_10 = local_20->ptr;
    local_8 = &local_1d8;
    local_1d8 = local_10;
    if (local_10 != (PerspectiveCameraNode *)0x0) {
      (*(local_10->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    store(in_stack_00000170,in_stack_00000168);
    local_58 = &local_1d8;
    if (local_1d8 != (PerspectiveCameraNode *)0x0) {
      (*(local_1d8->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    local_1d0 = local_1d0 + 1;
  }
  paVar3 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"AnimatedPerspectiveCamera",paVar3);
  close(in_RDI,(int)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::AnimatedPerspectiveCameraNode> camera, ssize_t id)
  {
    open(std::string("AnimatedPerspectiveCamera ")+
         "name=\"" + camera->name + "\" "
         "time_range=\""+std::to_string(camera->time_range.lower)+" "+std::to_string(camera->time_range.upper)+"\"");
    
    for (size_t i=0; i<camera->size(); i++)
      store(camera->cameras[i].dynamicCast<SceneGraph::Node>());
    
    close("AnimatedPerspectiveCamera");
  }